

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

void __thiscall
BaseIndex::DB::DB(DB *this,path *path,size_t n_cache_size,bool f_memory,bool f_wipe,bool f_obfuscate
                 )

{
  long in_FS_OFFSET;
  DBOptions options;
  DBOptions local_71;
  DBParams local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::filesystem::__cxx11::path::path((path *)&local_70,&path->super_path);
  local_71.force_compact = false;
  local_70.cache_bytes = n_cache_size;
  local_70.memory_only = f_memory;
  local_70.wipe_data = f_wipe;
  local_70.obfuscate = f_obfuscate;
  ::node::ReadDatabaseArgs(&gArgs,&local_71);
  local_70.options.force_compact = local_71.force_compact;
  CDBWrapper::CDBWrapper(&this->super_CDBWrapper,&local_70);
  std::filesystem::__cxx11::path::~path((path *)&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BaseIndex::DB::DB(const fs::path& path, size_t n_cache_size, bool f_memory, bool f_wipe, bool f_obfuscate) :
    CDBWrapper{DBParams{
        .path = path,
        .cache_bytes = n_cache_size,
        .memory_only = f_memory,
        .wipe_data = f_wipe,
        .obfuscate = f_obfuscate,
        .options = [] { DBOptions options; node::ReadDatabaseArgs(gArgs, options); return options; }()}}
{}